

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize.h
# Opt level: O0

stbir_uint32 stbir__calculate_memory(stbir__info *info)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int filter_height;
  int pixel_margin;
  stbir__info *info_local;
  
  iVar1 = stbir__get_filter_pixel_margin(info->horizontal_filter,info->horizontal_scale);
  iVar2 = stbir__get_filter_pixel_width(info->vertical_filter,info->vertical_scale);
  iVar3 = stbir__get_contributors
                    (info->horizontal_scale,info->horizontal_filter,info->input_w,info->output_w);
  info->horizontal_num_contributors = iVar3;
  iVar3 = stbir__get_contributors
                    (info->vertical_scale,info->vertical_filter,info->input_h,info->output_h);
  info->vertical_num_contributors = iVar3;
  info->ring_buffer_num_entries = iVar2 + 1;
  info->horizontal_contributors_size = info->horizontal_num_contributors << 3;
  iVar2 = stbir__get_total_horizontal_coefficients(info);
  info->horizontal_coefficients_size = iVar2 << 2;
  info->vertical_contributors_size = info->vertical_num_contributors << 3;
  iVar2 = stbir__get_total_vertical_coefficients(info);
  info->vertical_coefficients_size = iVar2 << 2;
  info->decode_buffer_size = (info->input_w + iVar1 * 2) * info->channels * 4;
  info->horizontal_buffer_size = info->output_w * info->channels * 4;
  info->ring_buffer_size = info->output_w * info->channels * info->ring_buffer_num_entries * 4;
  info->encode_buffer_size = info->output_w * info->channels * 4;
  if (info->horizontal_filter == STBIR_FILTER_DEFAULT) {
    __assert_fail("info->horizontal_filter != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmarcinkovic[P]NeuralNetwork/imageLoader/stb_image_resize.h"
                  ,0x8e3,"stbir_uint32 stbir__calculate_memory(stbir__info *)");
  }
  if (STBIR_FILTER_MITCHELL < info->horizontal_filter) {
    __assert_fail("info->horizontal_filter < (sizeof((stbir__filter_info_table))/sizeof((stbir__filter_info_table)[0]))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmarcinkovic[P]NeuralNetwork/imageLoader/stb_image_resize.h"
                  ,0x8e4,"stbir_uint32 stbir__calculate_memory(stbir__info *)");
  }
  if (info->vertical_filter == STBIR_FILTER_DEFAULT) {
    __assert_fail("info->vertical_filter != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmarcinkovic[P]NeuralNetwork/imageLoader/stb_image_resize.h"
                  ,0x8e5,"stbir_uint32 stbir__calculate_memory(stbir__info *)");
  }
  if (info->vertical_filter < (STBIR_FILTER_CATMULLROM|STBIR_FILTER_TRIANGLE)) {
    iVar1 = stbir__use_height_upsampling(info);
    if (iVar1 == 0) {
      info->encode_buffer_size = 0;
    }
    else {
      info->horizontal_buffer_size = 0;
    }
    return info->horizontal_contributors_size + info->horizontal_coefficients_size +
           info->vertical_contributors_size + info->vertical_coefficients_size +
           info->decode_buffer_size + info->horizontal_buffer_size + info->ring_buffer_size +
           info->encode_buffer_size;
  }
  __assert_fail("info->vertical_filter < (sizeof((stbir__filter_info_table))/sizeof((stbir__filter_info_table)[0]))"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/dmarcinkovic[P]NeuralNetwork/imageLoader/stb_image_resize.h"
                ,0x8e6,"stbir_uint32 stbir__calculate_memory(stbir__info *)");
}

Assistant:

static stbir_uint32 stbir__calculate_memory(stbir__info *info)
{
    int pixel_margin = stbir__get_filter_pixel_margin(info->horizontal_filter, info->horizontal_scale);
    int filter_height = stbir__get_filter_pixel_width(info->vertical_filter, info->vertical_scale);

    info->horizontal_num_contributors = stbir__get_contributors(info->horizontal_scale, info->horizontal_filter, info->input_w, info->output_w);
    info->vertical_num_contributors   = stbir__get_contributors(info->vertical_scale  , info->vertical_filter  , info->input_h, info->output_h);

    // One extra entry because floating point precision problems sometimes cause an extra to be necessary.
    info->ring_buffer_num_entries = filter_height + 1;

    info->horizontal_contributors_size = info->horizontal_num_contributors * sizeof(stbir__contributors);
    info->horizontal_coefficients_size = stbir__get_total_horizontal_coefficients(info) * sizeof(float);
    info->vertical_contributors_size = info->vertical_num_contributors * sizeof(stbir__contributors);
    info->vertical_coefficients_size = stbir__get_total_vertical_coefficients(info) * sizeof(float);
    info->decode_buffer_size = (info->input_w + pixel_margin * 2) * info->channels * sizeof(float);
    info->horizontal_buffer_size = info->output_w * info->channels * sizeof(float);
    info->ring_buffer_size = info->output_w * info->channels * info->ring_buffer_num_entries * sizeof(float);
    info->encode_buffer_size = info->output_w * info->channels * sizeof(float);

    STBIR_ASSERT(info->horizontal_filter != 0);
    STBIR_ASSERT(info->horizontal_filter < STBIR__ARRAY_SIZE(stbir__filter_info_table)); // this now happens too late
    STBIR_ASSERT(info->vertical_filter != 0);
    STBIR_ASSERT(info->vertical_filter < STBIR__ARRAY_SIZE(stbir__filter_info_table)); // this now happens too late

    if (stbir__use_height_upsampling(info))
        // The horizontal buffer is for when we're downsampling the height and we
        // can't output the result of sampling the decode buffer directly into the
        // ring buffers.
        info->horizontal_buffer_size = 0;
    else
        // The encode buffer is to retain precision in the height upsampling method
        // and isn't used when height downsampling.
        info->encode_buffer_size = 0;

    return info->horizontal_contributors_size + info->horizontal_coefficients_size
        + info->vertical_contributors_size + info->vertical_coefficients_size
        + info->decode_buffer_size + info->horizontal_buffer_size
        + info->ring_buffer_size + info->encode_buffer_size;
}